

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

double * __thiscall vec<2UL,_double>::operator[](vec<2UL,_double> *this,size_t i)

{
  vec<2UL,_double> *local_30;
  size_t i_local;
  vec<2UL,_double> *this_local;
  
  if (1 < i) {
    __assert_fail("i >= 0 && i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                  ,0x71,"T &vec<2>::operator[](const size_t) [n = 2, T = double]");
  }
  local_30 = this;
  if (i != 0) {
    local_30 = (vec<2UL,_double> *)&this->y;
  }
  return &local_30->x;
}

Assistant:

T& operator[](const size_t i)
    {
        assert(i >= 0 && i < 2);
        return i == 0 ? x : y;
    }